

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

void deqp::gls::FboUtil::config::glInit(Texture *cfg,Functions *gl)

{
  GLenum target;
  Texture3D *pTVar1;
  TextureLayered *local_a0;
  TextureLayered *local_90;
  uint *local_78;
  Image *local_60;
  Texture2DArray *t2a;
  Texture3D *t3d;
  GLenum *it;
  Range<unsigned_int> range;
  TextureCubeMap *tcm;
  Texture2D *t2d;
  Functions *gl_local;
  Texture *cfg_local;
  
  if (cfg == (Texture *)0x0) {
    local_60 = (Image *)0x0;
  }
  else {
    local_60 = (Image *)__dynamic_cast(cfg,&Texture::typeinfo,&Texture2D::typeinfo,0);
  }
  if (local_60 == (Image *)0x0) {
    if (cfg == (Texture *)0x0) {
      local_78 = (uint *)0x0;
    }
    else {
      local_78 = (uint *)__dynamic_cast(cfg,&Texture::typeinfo,&TextureCubeMap::typeinfo,0);
    }
    range.m_end = local_78;
    if (local_78 == (uint *)0x0) {
      if (cfg == (Texture *)0x0) {
        local_90 = (TextureLayered *)0x0;
      }
      else {
        local_90 = (TextureLayered *)__dynamic_cast(cfg,&Texture::typeinfo,&Texture3D::typeinfo,0);
      }
      if (local_90 == (TextureLayered *)0x0) {
        if (cfg == (Texture *)0x0) {
          local_a0 = (TextureLayered *)0x0;
        }
        else {
          local_a0 = (TextureLayered *)
                     __dynamic_cast(cfg,&Texture::typeinfo,&Texture2DArray::typeinfo,0);
        }
        if (local_a0 != (TextureLayered *)0x0) {
          glInitLayered(local_a0,1,gl);
        }
      }
      else {
        glInitLayered(local_90,2,gl);
      }
    }
    else {
      it = glInit::s_cubeMapFaces;
      range.m_begin = (uint *)anon_var_dwarf_8e3845;
      for (t3d = (Texture3D *)Range<unsigned_int>::begin((Range<unsigned_int> *)&it);
          pTVar1 = (Texture3D *)Range<unsigned_int>::end((Range<unsigned_int> *)&it), t3d != pTVar1;
          t3d = (Texture3D *)
                ((long)&(t3d->super_TextureLayered).super_Texture.super_Image.super_Config.
                        _vptr_Config + 4)) {
        glInitFlat((TextureFlat *)range.m_end,
                   *(GLenum *)
                    &(t3d->super_TextureLayered).super_Texture.super_Image.super_Config._vptr_Config
                   ,gl);
      }
    }
  }
  else {
    target = glTarget(local_60);
    glInitFlat((TextureFlat *)local_60,target,gl);
  }
  return;
}

Assistant:

static void glInit (const Texture& cfg, const glw::Functions& gl)
{
	if (const Texture2D* t2d = dynamic_cast<const Texture2D*>(&cfg))
		glInitFlat(*t2d, glTarget(*t2d), gl);
	else if (const TextureCubeMap* tcm = dynamic_cast<const TextureCubeMap*>(&cfg))
	{
		// \todo [2013-12-05 lauri]
		// move this to glu or someplace sensible (this array is already
		// present in duplicates)
		static const GLenum s_cubeMapFaces[] =
			{
				GL_TEXTURE_CUBE_MAP_NEGATIVE_X,
				GL_TEXTURE_CUBE_MAP_POSITIVE_X,
				GL_TEXTURE_CUBE_MAP_NEGATIVE_Y,
				GL_TEXTURE_CUBE_MAP_POSITIVE_Y,
				GL_TEXTURE_CUBE_MAP_NEGATIVE_Z,
				GL_TEXTURE_CUBE_MAP_POSITIVE_Z,
			};
		const Range<GLenum> range = GLS_ARRAY_RANGE(s_cubeMapFaces);
		for (const GLenum* it = range.begin(); it != range.end(); it++)
			glInitFlat(*tcm, *it, gl);
	}
	else if (const Texture3D* t3d = dynamic_cast<const Texture3D*>(&cfg))
		glInitLayered(*t3d, 2, gl);
	else if (const Texture2DArray* t2a = dynamic_cast<const Texture2DArray*>(&cfg))
		glInitLayered(*t2a, 1, gl);
}